

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O1

int32_t icu_63::Transliterator::countAvailableVariants(UnicodeString *source,UnicodeString *target)

{
  UBool UVar1;
  uint in_EAX;
  int32_t iVar2;
  UErrorCode ec;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  umtx_lock_63(&registryMutex);
  uStack_18 = (ulong)(uint)uStack_18;
  if (registry == (TransliteratorRegistry *)0x0) {
    UVar1 = initializeRegistry((UErrorCode *)((long)&uStack_18 + 4));
    if (UVar1 == '\0') {
      iVar2 = 0;
      goto LAB_00277fd4;
    }
  }
  iVar2 = TransliteratorRegistry::countAvailableVariants(registry,source,target);
LAB_00277fd4:
  umtx_unlock_63(&registryMutex);
  return iVar2;
}

Assistant:

int32_t U_EXPORT2 Transliterator::countAvailableVariants(const UnicodeString& source,
                                               const UnicodeString& target) {
    Mutex lock(&registryMutex);
    UErrorCode ec = U_ZERO_ERROR;
    return HAVE_REGISTRY(ec) ? _countAvailableVariants(source, target) : 0;
}